

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaig.h
# Opt level: O0

Mini_Aig_t * Mini_AigLoad(char *pFileName)

{
  size_t sVar1;
  char *pcVar2;
  int local_30;
  undefined4 local_2c;
  int nSize;
  int RetValue;
  FILE *pFile;
  Mini_Aig_t *p;
  char *pFileName_local;
  
  p = (Mini_Aig_t *)pFileName;
  _nSize = fopen(pFileName,"rb");
  if (_nSize == (FILE *)0x0) {
    printf("Cannot open file for reading \"%s\".\n",p);
    pFileName_local = (char *)0x0;
  }
  else {
    sVar1 = fread(&local_30,4,1,_nSize);
    local_2c = (undefined4)sVar1;
    pFile = (FILE *)calloc(1,0x18);
    pFile->_flags = local_30;
    *(int *)&pFile->field_0x4 = local_30;
    pcVar2 = (char *)malloc((long)pFile->_flags << 2);
    pFile->_IO_read_end = pcVar2;
    sVar1 = fread(&pFile->_IO_read_ptr,4,1,_nSize);
    local_2c = (undefined4)sVar1;
    sVar1 = fread(pFile->_IO_read_end,4,(long)*(int *)&pFile->field_0x4,_nSize);
    local_2c = (undefined4)sVar1;
    fclose(_nSize);
    pFileName_local = (char *)pFile;
  }
  return (Mini_Aig_t *)pFileName_local;
}

Assistant:

static Mini_Aig_t * Mini_AigLoad( char * pFileName )
{
    Mini_Aig_t * p;
    FILE * pFile;
    int RetValue, nSize;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file for reading \"%s\".\n", pFileName );
        return NULL;
    }
    RetValue = fread( &nSize, sizeof(int), 1, pFile );
    p = MINI_AIG_CALLOC( Mini_Aig_t, 1 );
    p->nSize = p->nCap = nSize;
    p->pArray = MINI_AIG_ALLOC( int, p->nCap );
    RetValue = fread( &p->nRegs, sizeof(int), 1, pFile );
    RetValue = fread( p->pArray, sizeof(int), p->nSize, pFile );
    fclose( pFile );
    return p;
}